

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctx.cpp
# Opt level: O1

void __thiscall zmq::thread_ctx_t::thread_ctx_t(thread_ctx_t *this)

{
  _Rb_tree_header *p_Var1;
  
  mutex_t::mutex_t(&this->_opt_sync);
  this->_thread_priority = -1;
  this->_thread_sched_policy = -1;
  p_Var1 = &(this->_thread_affinity_cpus)._M_t._M_impl.super__Rb_tree_header;
  (this->_thread_affinity_cpus)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_thread_affinity_cpus)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_thread_affinity_cpus)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_thread_affinity_cpus)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_thread_affinity_cpus)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_thread_name_prefix)._M_dataplus._M_p = (pointer)&(this->_thread_name_prefix).field_2;
  (this->_thread_name_prefix)._M_string_length = 0;
  (this->_thread_name_prefix).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

zmq::thread_ctx_t::thread_ctx_t () :
    _thread_priority (ZMQ_THREAD_PRIORITY_DFLT),
    _thread_sched_policy (ZMQ_THREAD_SCHED_POLICY_DFLT)
{
}